

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void anon_unknown.dwarf_1117a3::AddErrorInfoWithLocation
               (ExpressionContext *ctx,SmallArray<ErrorInfo_*,_4U> *errorList,SynBase *source,
               char *messageStart,char *messageEnd)

{
  uint uVar1;
  Allocator *pAVar2;
  char *__s;
  Lexeme *pLVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar6;
  size_t sVar7;
  ModuleData *pMVar8;
  ErrorInfo *pEVar5;
  
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  pEVar5 = (ErrorInfo *)CONCAT44(extraout_var,iVar4);
  pAVar2 = ctx->allocator;
  pcVar6 = (source->pos).begin;
  pEVar5->messageStart = messageStart;
  pEVar5->messageEnd = messageEnd;
  pLVar3 = source->end;
  pEVar5->begin = source->begin;
  pEVar5->end = pLVar3;
  pEVar5->pos = pcVar6;
  (pEVar5->related).allocator = pAVar2;
  (pEVar5->related).data = (pEVar5->related).little;
  (pEVar5->related).count = 0;
  (pEVar5->related).max = 4;
  pEVar5->parentModule = (ModuleData *)0x0;
  if (errorList->count == errorList->max) {
    SmallArray<ErrorInfo_*,_4U>::grow(errorList,errorList->count);
  }
  if (errorList->data != (ErrorInfo **)0x0) {
    uVar1 = errorList->count;
    errorList->count = uVar1 + 1;
    errorList->data[uVar1] = pEVar5;
    pcVar6 = FindModuleCodeWithSourceLocation(ctx,(source->pos).begin);
    if (pcVar6 != (char *)0x0) {
      AddErrorLocationInfo(pcVar6,(source->pos).begin,ctx->errorBuf,ctx->errorBufSize);
      __s = ctx->errorBufLocation;
      sVar7 = strlen(__s);
      ctx->errorBufLocation = __s + sVar7;
      if (pcVar6 != ctx->code) {
        pMVar8 = FindModuleWithSourceLocation(ctx,(source->pos).begin);
        if (pMVar8 != (ModuleData *)0x0) {
          NULLC::SafeSprintf(ctx->errorBufLocation,
                             (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                                    ctx->errorBufSize)," [in module \'%.*s\']\n",
                             (ulong)(uint)(*(int *)&(pMVar8->name).end - (int)(pMVar8->name).begin))
          ;
          pcVar6 = ctx->errorBufLocation;
          sVar7 = strlen(pcVar6);
          ctx->errorBufLocation = pcVar6 + sVar7;
          if (errorList->count == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,"T &SmallArray<ErrorInfo *, 4>::back() [T = ErrorInfo *, N = 4]");
          }
          errorList->data[errorList->count - 1]->parentModule = pMVar8;
        }
      }
    }
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]");
}

Assistant:

void AddErrorInfoWithLocation(ExpressionContext &ctx, SmallArray<ErrorInfo*, 4> &errorList, SynBase *source, const char *messageStart, const char *messageEnd)
	{
		errorList.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, source->pos.begin));

		if(const char *code = FindModuleCodeWithSourceLocation(ctx, source->pos.begin))
		{
			AddErrorLocationInfo(code, source->pos.begin, ctx.errorBuf, ctx.errorBufSize);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			if(code != ctx.code)
			{
				ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

				if(parentModule)
				{
					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					errorList.back()->parentModule = parentModule;
				}
			}
		}
	}